

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_simd_3same_pair
               (DisasContext_conflict1 *s,int is_q,int u,int opcode,int size,int rn,int rm,int rd)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint uVar2;
  TCGv_i64 tcg_dest;
  TCGv_i64 tcg_dest_00;
  TCGv_i64 pTVar3;
  TCGv_i32 tcg_dest_01;
  TCGv_i32 tcg_dest_02;
  TCGv_i32 pTVar4;
  bool local_cd;
  int local_cc;
  int local_bc;
  int passelt;
  int passreg_1;
  NeonGenTwoOpFn *genfn;
  TCGv_i32 tcg_op2_1;
  TCGv_i32 tcg_op1_1;
  TCGv_i32 tcg_res_1 [4];
  int maxpass;
  int passreg;
  TCGv_i64 tcg_op2;
  TCGv_i64 tcg_op1;
  TCGv_i64 tcg_res [2];
  uint local_3c;
  TCGv_ptr pTStack_38;
  int pass;
  TCGv_ptr fpst;
  TCGContext_conflict1 *tcg_ctx;
  int rn_local;
  int size_local;
  int opcode_local;
  int u_local;
  int is_q_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (opcode < 0x58) {
    pTStack_38 = (TCGv_ptr)0x0;
  }
  else {
    pTStack_38 = get_fpstatus_ptr_aarch64(tcg_ctx_00,false);
  }
  _Var1 = fp_access_check(s);
  if (_Var1) {
    if (size == 3) {
      for (local_3c = 0; (int)local_3c < 2; local_3c = local_3c + 1) {
        tcg_dest = tcg_temp_new_i64(tcg_ctx_00);
        tcg_dest_00 = tcg_temp_new_i64(tcg_ctx_00);
        local_bc = rn;
        if (local_3c != 0) {
          local_bc = rm;
        }
        read_vec_element(s,tcg_dest,local_bc,0,MO_64);
        read_vec_element(s,tcg_dest_00,local_bc,1,MO_64);
        pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
        tcg_res[(long)(int)local_3c + -1] = pTVar3;
        if (opcode == 0x17) {
          tcg_gen_add_i64(tcg_ctx_00,tcg_res[(long)(int)local_3c + -1],tcg_dest,tcg_dest_00);
        }
        else if (opcode == 0x58) {
          gen_helper_vfp_maxnumd
                    (tcg_ctx_00,tcg_res[(long)(int)local_3c + -1],tcg_dest,tcg_dest_00,pTStack_38);
        }
        else if (opcode == 0x5a) {
          gen_helper_vfp_addd(tcg_ctx_00,tcg_res[(long)(int)local_3c + -1],tcg_dest,tcg_dest_00,
                              pTStack_38);
        }
        else if (opcode == 0x5e) {
          gen_helper_vfp_maxd(tcg_ctx_00,tcg_res[(long)(int)local_3c + -1],tcg_dest,tcg_dest_00,
                              pTStack_38);
        }
        else if (opcode == 0x78) {
          gen_helper_vfp_minnumd
                    (tcg_ctx_00,tcg_res[(long)(int)local_3c + -1],tcg_dest,tcg_dest_00,pTStack_38);
        }
        else {
          if (opcode != 0x7e) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,0x2bfd,(char *)0x0);
          }
          gen_helper_vfp_mind(tcg_ctx_00,tcg_res[(long)(int)local_3c + -1],tcg_dest,tcg_dest_00,
                              pTStack_38);
        }
        tcg_temp_free_i64(tcg_ctx_00,tcg_dest);
        tcg_temp_free_i64(tcg_ctx_00,tcg_dest_00);
      }
      for (local_3c = 0; (int)local_3c < 2; local_3c = local_3c + 1) {
        write_vec_element(s,tcg_res[(long)(int)local_3c + -1],rd,local_3c,MO_64);
        tcg_temp_free_i64(tcg_ctx_00,tcg_res[(long)(int)local_3c + -1]);
      }
    }
    else {
      uVar2 = 2;
      if (is_q != 0) {
        uVar2 = 4;
      }
      for (local_3c = 0; (int)local_3c < (int)uVar2; local_3c = local_3c + 1) {
        tcg_dest_01 = tcg_temp_new_i32(tcg_ctx_00);
        tcg_dest_02 = tcg_temp_new_i32(tcg_ctx_00);
        _passelt = (NeonGenTwoOpFn *)0x0;
        local_cc = rn;
        if ((int)(uVar2 / 2) <= (int)local_3c) {
          local_cc = rm;
        }
        local_cd = is_q != 0 && (local_3c & 1) != 0;
        read_vec_element_i32(s,tcg_dest_01,local_cc,(uint)local_cd * 2,MO_32);
        read_vec_element_i32(s,tcg_dest_02,local_cc,(uint)local_cd * 2 + 1,MO_32);
        pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
        tcg_res_1[(long)(int)local_3c + -1] = pTVar4;
        if (opcode == 0x14) {
          _passelt = handle_simd_3same_pair::fns_1[size][u];
        }
        else if (opcode == 0x15) {
          _passelt = handle_simd_3same_pair::fns_2[size][u];
        }
        else if (opcode == 0x17) {
          _passelt = handle_simd_3same_pair::fns[size];
        }
        else if (opcode == 0x58) {
          gen_helper_vfp_maxnums
                    (tcg_ctx_00,tcg_res_1[(long)(int)local_3c + -1],tcg_dest_01,tcg_dest_02,
                     pTStack_38);
        }
        else if (opcode == 0x5a) {
          gen_helper_vfp_adds(tcg_ctx_00,tcg_res_1[(long)(int)local_3c + -1],tcg_dest_01,tcg_dest_02
                              ,pTStack_38);
        }
        else if (opcode == 0x5e) {
          gen_helper_vfp_maxs(tcg_ctx_00,tcg_res_1[(long)(int)local_3c + -1],tcg_dest_01,tcg_dest_02
                              ,pTStack_38);
        }
        else if (opcode == 0x78) {
          gen_helper_vfp_minnums
                    (tcg_ctx_00,tcg_res_1[(long)(int)local_3c + -1],tcg_dest_01,tcg_dest_02,
                     pTStack_38);
        }
        else {
          if (opcode != 0x7e) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,0x2c47,(char *)0x0);
          }
          gen_helper_vfp_mins(tcg_ctx_00,tcg_res_1[(long)(int)local_3c + -1],tcg_dest_01,tcg_dest_02
                              ,pTStack_38);
        }
        if (_passelt != (NeonGenTwoOpFn *)0x0) {
          (*_passelt)(tcg_ctx_00,tcg_res_1[(long)(int)local_3c + -1],tcg_dest_01,tcg_dest_02);
        }
        tcg_temp_free_i32(tcg_ctx_00,tcg_dest_01);
        tcg_temp_free_i32(tcg_ctx_00,tcg_dest_02);
      }
      for (local_3c = 0; (int)local_3c < (int)uVar2; local_3c = local_3c + 1) {
        write_vec_element_i32(s,tcg_res_1[(long)(int)local_3c + -1],rd,local_3c,MO_32);
        tcg_temp_free_i32(tcg_ctx_00,tcg_res_1[(long)(int)local_3c + -1]);
      }
      clear_vec_high(s,is_q != 0,rd);
    }
    if (pTStack_38 != (TCGv_ptr)0x0) {
      tcg_temp_free_ptr(tcg_ctx_00,pTStack_38);
    }
  }
  return;
}

Assistant:

static void handle_simd_3same_pair(DisasContext *s, int is_q, int u, int opcode,
                                   int size, int rn, int rm, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst;
    int pass;

    /* Floating point operations need fpst */
    if (opcode >= 0x58) {
        fpst = get_fpstatus_ptr(tcg_ctx, false);
    } else {
        fpst = NULL;
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* These operations work on the concatenated rm:rn, with each pair of
     * adjacent elements being operated on to produce an element in the result.
     */
    if (size == 3) {
        TCGv_i64 tcg_res[2];

        for (pass = 0; pass < 2; pass++) {
            TCGv_i64 tcg_op1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 tcg_op2 = tcg_temp_new_i64(tcg_ctx);
            int passreg = (pass == 0) ? rn : rm;

            read_vec_element(s, tcg_op1, passreg, 0, MO_64);
            read_vec_element(s, tcg_op2, passreg, 1, MO_64);
            tcg_res[pass] = tcg_temp_new_i64(tcg_ctx);

            switch (opcode) {
            case 0x17: /* ADDP */
                tcg_gen_add_i64(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2);
                break;
            case 0x58: /* FMAXNMP */
                gen_helper_vfp_maxnumd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5a: /* FADDP */
                gen_helper_vfp_addd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5e: /* FMAXP */
                gen_helper_vfp_maxd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x78: /* FMINNMP */
                gen_helper_vfp_minnumd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x7e: /* FMINP */
                gen_helper_vfp_mind(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            tcg_temp_free_i64(tcg_ctx, tcg_op1);
            tcg_temp_free_i64(tcg_ctx, tcg_op2);
        }

        for (pass = 0; pass < 2; pass++) {
            write_vec_element(s, tcg_res[pass], rd, pass, MO_64);
            tcg_temp_free_i64(tcg_ctx, tcg_res[pass]);
        }
    } else {
        int maxpass = is_q ? 4 : 2;
        TCGv_i32 tcg_res[4];

        for (pass = 0; pass < maxpass; pass++) {
            TCGv_i32 tcg_op1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_op2 = tcg_temp_new_i32(tcg_ctx);
            NeonGenTwoOpFn *genfn = NULL;
            int passreg = pass < (maxpass / 2) ? rn : rm;
            int passelt = (is_q && (pass & 1)) ? 2 : 0;

            read_vec_element_i32(s, tcg_op1, passreg, passelt, MO_32);
            read_vec_element_i32(s, tcg_op2, passreg, passelt + 1, MO_32);
            tcg_res[pass] = tcg_temp_new_i32(tcg_ctx);

            switch (opcode) {
            case 0x17: /* ADDP */
            {
                static NeonGenTwoOpFn * const fns[3] = {
                    gen_helper_neon_padd_u8,
                    gen_helper_neon_padd_u16,
                    tcg_gen_add_i32,
                };
                genfn = fns[size];
                break;
            }
            case 0x14: /* SMAXP, UMAXP */
            {
                static NeonGenTwoOpFn * const fns[3][2] = {
                    { gen_helper_neon_pmax_s8, gen_helper_neon_pmax_u8 },
                    { gen_helper_neon_pmax_s16, gen_helper_neon_pmax_u16 },
                    { tcg_gen_smax_i32, tcg_gen_umax_i32 },
                };
                genfn = fns[size][u];
                break;
            }
            case 0x15: /* SMINP, UMINP */
            {
                static NeonGenTwoOpFn * const fns[3][2] = {
                    { gen_helper_neon_pmin_s8, gen_helper_neon_pmin_u8 },
                    { gen_helper_neon_pmin_s16, gen_helper_neon_pmin_u16 },
                    { tcg_gen_smin_i32, tcg_gen_umin_i32 },
                };
                genfn = fns[size][u];
                break;
            }
            /* The FP operations are all on single floats (32 bit) */
            case 0x58: /* FMAXNMP */
                gen_helper_vfp_maxnums(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5a: /* FADDP */
                gen_helper_vfp_adds(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5e: /* FMAXP */
                gen_helper_vfp_maxs(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x78: /* FMINNMP */
                gen_helper_vfp_minnums(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x7e: /* FMINP */
                gen_helper_vfp_mins(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            /* FP ops called directly, otherwise call now */
            if (genfn) {
                genfn(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2);
            }

            tcg_temp_free_i32(tcg_ctx, tcg_op1);
            tcg_temp_free_i32(tcg_ctx, tcg_op2);
        }

        for (pass = 0; pass < maxpass; pass++) {
            write_vec_element_i32(s, tcg_res[pass], rd, pass, MO_32);
            tcg_temp_free_i32(tcg_ctx, tcg_res[pass]);
        }
        clear_vec_high(s, is_q, rd);
    }

    if (fpst) {
        tcg_temp_free_ptr(tcg_ctx, fpst);
    }
}